

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall
cplus::socket::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  char *__cp;
  Exception *pEVar2;
  int *piVar3;
  String local_c0;
  string local_a8;
  undefined1 local_88 [32];
  String local_68;
  String local_50;
  Int local_38;
  
  iVar1 = ::socket(2,1,6);
  this->socket = iVar1;
  if (iVar1 < 0) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x838);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Create Socket Failed!: ","");
    piVar3 = __errno_location();
    local_68.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124278;
    local_68.value.super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_68.value.
                  super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,*piVar3);
    lang::Int::toString(&local_c0,(Int *)&local_68);
    lang::operator+((String *)local_88,&local_a8,&local_c0);
    system::Exception::Exception(pEVar2,(String *)local_88);
    (pEVar2->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124c48;
    *(undefined ***)&pEVar2->super_exception = &PTR__SocketException_00124c78;
    __cxa_throw(pEVar2,&SocketException::typeinfo,system::Exception::~Exception);
  }
  iVar1 = bind(iVar1,(sockaddr *)&this->local_addr,0x10);
  if (iVar1 != 0) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x838);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Client Bind Port Failed!: ","");
    piVar3 = __errno_location();
    local_68.value.super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(long)*piVar3;
    local_68.super_Object._vptr_Object = (_func_int **)&PTR_toString_001245e8;
    lang::Long::toString(&local_c0,(Long *)&local_68);
    lang::operator+((String *)local_88,&local_a8,&local_c0);
    system::Exception::Exception(pEVar2,(String *)local_88);
    (pEVar2->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124c48;
    *(undefined ***)&pEVar2->super_exception = &PTR__SocketException_00124c78;
    __cxa_throw(pEVar2,&SocketException::typeinfo,system::Exception::~Exception);
  }
  __cp = lang::String::c_str(&this->address);
  iVar1 = inet_aton(__cp,(in_addr *)&(this->addr).sin_addr);
  if (iVar1 == 0) {
    pEVar2 = (Exception *)__cxa_allocate_exception(0x838);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Server IP Address Error!: ","");
    piVar3 = __errno_location();
    local_68.value.super___shared_ptr<cplus::lang::CPlusString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(long)*piVar3;
    local_68.super_Object._vptr_Object = (_func_int **)&PTR_toString_001245e8;
    lang::Long::toString(&local_c0,(Long *)&local_68);
    lang::operator+((String *)local_88,&local_a8,&local_c0);
    system::Exception::Exception(pEVar2,(String *)local_88);
    (pEVar2->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124c48;
    *(undefined ***)&pEVar2->super_exception = &PTR__SocketException_00124c78;
    __cxa_throw(pEVar2,&SocketException::typeinfo,system::Exception::~Exception);
  }
  iVar1 = ::connect(this->socket,(sockaddr *)&this->addr,0x10);
  if (-1 < iVar1) {
    return iVar1;
  }
  pEVar2 = (Exception *)__cxa_allocate_exception(0x838);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Can Not Connect To ","");
  lang::operator+(&local_50,&local_a8,&this->address);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,", error code: ","");
  lang::String::operator+(&local_68,&local_50,(string *)local_88);
  piVar3 = __errno_location();
  local_38.value = *piVar3;
  local_38.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124278;
  lang::operator+(&local_c0,&local_68,&local_38);
  system::Exception::Exception(pEVar2,&local_c0);
  (pEVar2->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00124c48;
  *(undefined ***)&pEVar2->super_exception = &PTR__SocketException_00124c78;
  __cxa_throw(pEVar2,&SocketException::typeinfo,system::Exception::~Exception);
}

Assistant:

void Socket::connect() {
			//创建用于internet的流协议(TCP)socket,用client_socket代表客户机socket
			socket = ::socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (socket < 0) {
				throw SocketException("Create Socket Failed!: " + lang::Int(errno).toString());
			}
			//把客户机的socket和客户机的socket地址结构联系起来
			if (::bind(socket, (struct sockaddr *) &local_addr, sizeof(local_addr))) {
				throw SocketException(
						"Client Bind Port Failed!: " + lang::Long(errno).toString());
			}
			
			if (inet_aton(address.c_str(), &addr.sin_addr) == 0) //服务器的IP地址来自程序的参数
			{
				throw SocketException(
						"Server IP Address Error!: " + lang::Long(errno).toString());
			}
			//向服务器发起连接,连接成功后client_socket代表了客户机和服务器的一个socket连接
			if (::connect(socket, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
				throw SocketException("Can Not Connect To " + address + ", error code: " +
				                      lang::Int(errno));
			}
		}